

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

string * czh::utils::colorify
                   (string *__return_storage_ptr__,string *str,Color with_color,ColorType type)

{
  pointer pcVar1;
  undefined8 uVar2;
  int iVar3;
  mapped_type *pmVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined8 extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  initializer_list<std::pair<const_czh::utils::ColorType,_czh::utils::CzhColor>_> __l;
  allocator_type local_6a;
  less<czh::utils::ColorType> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  source_location local_20;
  
  if (with_color == no_color) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  }
  else {
    local_20._M_impl._0_4_ = type;
    if ((get_color(czh::utils::ColorType)::colors == '\0') &&
       (iVar3 = __cxa_guard_acquire(&get_color(czh::utils::ColorType)::colors), iVar3 != 0)) {
      local_38 = 0x100000005;
      uStack_30 = 0x100000006;
      local_48 = 4;
      uStack_40 = 7;
      local_68.field_2._M_allocated_capacity = 2;
      local_68.field_2._8_8_ = 0x200000003;
      local_68._M_dataplus._M_p = (pointer)0x300000000;
      local_68._M_string_length = 0x100000001;
      __l._M_len = 8;
      __l._M_array = (iterator)&local_68;
      std::
      map<czh::utils::ColorType,_czh::utils::CzhColor,_std::less<czh::utils::ColorType>,_std::allocator<std::pair<const_czh::utils::ColorType,_czh::utils::CzhColor>_>_>
      ::map((map<czh::utils::ColorType,_czh::utils::CzhColor,_std::less<czh::utils::ColorType>,_std::allocator<std::pair<const_czh::utils::ColorType,_czh::utils::CzhColor>_>_>
             *)get_color(czh::utils::ColorType)::colors,__l,&local_69,&local_6a);
      __cxa_atexit(std::
                   map<czh::utils::ColorType,_czh::utils::CzhColor,_std::less<czh::utils::ColorType>,_std::allocator<std::pair<const_czh::utils::ColorType,_czh::utils::CzhColor>_>_>
                   ::~map,get_color(czh::utils::ColorType)::colors,&__dso_handle);
      __cxa_guard_release(&get_color(czh::utils::ColorType)::colors);
    }
    pmVar4 = std::
             map<czh::utils::ColorType,_czh::utils::CzhColor,_std::less<czh::utils::ColorType>,_std::allocator<std::pair<const_czh::utils::ColorType,_czh::utils::CzhColor>_>_>
             ::at((map<czh::utils::ColorType,_czh::utils::CzhColor,_std::less<czh::utils::ColorType>,_std::allocator<std::pair<const_czh::utils::ColorType,_czh::utils::CzhColor>_>_>
                   *)get_color(czh::utils::ColorType)::colors,(key_type *)&local_20);
    switch(*pmVar4) {
    case BLUE:
      std::operator+(&local_68,"\x1b[34m",str);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_68,"\x1b[0m");
      break;
    case LIGHT_BLUE:
      std::operator+(&local_68,"\x1b[36m",str);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_68,"\x1b[0m");
      break;
    case GREEN:
      std::operator+(&local_68,"\x1b[32m",str);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_68,"\x1b[0m");
      break;
    case PURPLE:
      std::operator+(&local_68,"\x1b[35m",str);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_68,"\x1b[0m");
      break;
    case YELLOW:
      std::operator+(&local_68,"\x1b[33m",str);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_68,"\x1b[0m");
      break;
    case WHITE:
      std::operator+(&local_68,"\x1b[37m",str);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_68,"\x1b[0m");
      break;
    case RED:
      std::operator+(&local_68,"\x1b[31m",str);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_68,"\x1b[0m");
      break;
    default:
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Something unreachable.","");
      local_20._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_0019f168;
      czh::error::czh_unreachable(&local_68,&local_20);
      __cxa_guard_abort(&get_color(czh::utils::ColorType)::colors);
      _Unwind_Resume(extraout_RAX);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar6) {
      uVar2 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string colorify(const std::string &str, Color with_color, ColorType type)
  {
    if (with_color == Color::no_color) return str;
    switch (get_color(type))
    {
      case CzhColor::PURPLE:
        return "\033[35m" + str + "\033[0m";
      case CzhColor::LIGHT_BLUE:
        return "\033[36m" + str + "\033[0m";
      case CzhColor::BLUE:
        return "\033[34m" + str + "\033[0m";
      case CzhColor::GREEN:
        return "\033[32m" + str + "\033[0m";
      case CzhColor::YELLOW:
        return "\033[33m" + str + "\033[0m";
      case CzhColor::WHITE:
        return "\033[37m" + str + "\033[0m";
      case CzhColor::RED:
        return "\033[31m" + str + "\033[0m";
      default:
        error::czh_unreachable();
    }
    error::czh_unreachable();
    return "";
  }